

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall embree::Scene::createInstanceExpensiveAccel(Scene *this)

{
  State *this_00;
  bool bVar1;
  Accel *accel;
  
  this_00 = *(State **)&(this->super_AccelN).field_0x188;
  bVar1 = State::hasISA(this_00,0x60000ff);
  if (((bVar1) && (this_00->frequency_level != FREQUENCY_SIMD128)) &&
     ((this->scene_flags & RTC_SCENE_FLAG_COMPACT) == RTC_SCENE_FLAG_NONE)) {
    accel = BVH8Factory::BVH8Instance
                      (*(BVH8Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x568),this,
                       true,(uint)(this->quality_flags == RTC_BUILD_QUALITY_LOW));
  }
  else {
    accel = BVH4Factory::BVH4Instance
                      (*(BVH4Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x560),this,
                       true,(uint)(this->quality_flags == RTC_BUILD_QUALITY_LOW));
  }
  AccelN::accels_add(&this->super_AccelN,accel);
  return;
}

Assistant:

void Scene::createInstanceExpensiveAccel()
  {
#if defined(EMBREE_GEOMETRY_INSTANCE)
    // if (device->object_accel == "default") 
    {
#if defined (EMBREE_TARGET_SIMD8)
      if (device->canUseAVX() && !isCompactAccel()) {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh8_factory->BVH8Instance(this, true, BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh8_factory->BVH8Instance(this, true, BVHFactory::BuildVariant::DYNAMIC));
        }
      } 
      else
#endif
      {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh4_factory->BVH4Instance(this, true, BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh4_factory->BVH4Instance(this, true, BVHFactory::BuildVariant::DYNAMIC));
        }
      }
    }
    // else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown instance accel "+device->instance_accel);
#endif
  }